

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
__thiscall
anon_unknown.dwarf_ecf33::BuildSystemImpl::createNode
          (BuildSystemImpl *this,StringRef name,bool isImplicit)

{
  char cVar1;
  char *__n;
  iterator pcVar2;
  undefined7 in_register_00000009;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  bool local_e1;
  bool isImplicit_local;
  BuildSystemImpl *this_local;
  StringRef name_local;
  int local_c;
  
  name_local.Data = (char *)CONCAT71(in_register_00000009,isImplicit);
  this_local = (BuildSystemImpl *)name.Length;
  name_local.Length = (size_t)this;
  __n = (char *)strlen("/");
  local_e1 = false;
  if (__n <= name_local.Data) {
    pcVar2 = llvm::StringRef::end((StringRef *)&this_local);
    if (__n == (char *)0x0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(pcVar2 + -(long)__n,"/",(size_t)__n);
    }
    local_e1 = local_c == 0;
  }
  if (local_e1) {
    name_00.Length = (size_t)this_local;
    name_00.Data = (char *)this;
    llbuild::buildsystem::BuildNode::makeDirectory(name_00);
  }
  else if (((name_local.Data == (char *)0x0) ||
           (cVar1 = llvm::StringRef::operator[]((StringRef *)&this_local,0), cVar1 != '<')) ||
          (cVar1 = llvm::StringRef::back((StringRef *)&this_local), cVar1 != '>')) {
    name_02.Length = (size_t)this_local;
    name_02.Data = (char *)this;
    llbuild::buildsystem::BuildNode::makePlain(name_02);
  }
  else {
    name_01.Length = (size_t)this_local;
    name_01.Data = (char *)this;
    llbuild::buildsystem::BuildNode::makeVirtual(name_01);
  }
  return (__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BuildNode>
BuildSystemImpl::createNode(StringRef name, bool isImplicit) {
  if (name.endswith("/")) {
    return BuildNode::makeDirectory(name);
  }

  if (!name.empty() && name[0] == '<' && name.back() == '>') {
    return BuildNode::makeVirtual(name);
  }

  return BuildNode::makePlain(name);
}